

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::ElementU
          (ByteCodeWriter *this,OpCode op,RegSlot instance,PropertyIdIndexType index)

{
  code *pcVar1;
  bool bVar2;
  RegSlot instance_00;
  undefined4 *puVar3;
  FunctionBody *this_00;
  RegSlot local_38;
  PropertyIdIndexType local_34;
  
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x43);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x727,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_008922f6;
    *puVar3 = 0;
  }
  if (instance != 0xffffffff) {
    this_00 = this->m_functionWrite;
    if (this_00 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) goto LAB_008922f6;
      *puVar3 = 0;
      this_00 = this->m_functionWrite;
    }
    instance_00 = FunctionBody::MapRegSlot(this_00,instance);
    bVar2 = TryWriteElementU<Js::LayoutSizePolicy<(Js::LayoutSize)0>>(this,op,instance_00,index);
    if (!bVar2) {
      bVar2 = TryWriteElementU<Js::LayoutSizePolicy<(Js::LayoutSize)1>>(this,op,instance_00,index);
      if (!bVar2) {
        _local_38 = CONCAT44(index,instance_00);
        Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,op,this);
        Data::Write(&this->m_byteCodeData,&local_38,8);
      }
    }
    return;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar2) {
    *puVar3 = 0;
    Throw::InternalError();
  }
LAB_008922f6:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::ElementU(OpCode op, RegSlot instance, PropertyIdIndexType index)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementU);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        instance = ConsumeReg(instance);

        MULTISIZE_LAYOUT_WRITE(ElementU, op, instance, index);
    }